

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCategoryWeights
          (BeagleCPUImpl<double,_1,_0> *this,int categoryWeightsIndex,double *inCategoryWeights)

{
  double **ppdVar1;
  int iVar2;
  double *pdVar3;
  
  iVar2 = -5;
  if ((-1 < categoryWeightsIndex) && (iVar2 = -5, categoryWeightsIndex < this->kEigenDecompCount)) {
    ppdVar1 = this->gCategoryWeights;
    if (ppdVar1[(uint)categoryWeightsIndex] == (double *)0x0) {
      pdVar3 = (double *)malloc((long)this->kCategoryCount << 3);
      ppdVar1[(uint)categoryWeightsIndex] = pdVar3;
      if (this->gCategoryWeights[(uint)categoryWeightsIndex] == (double *)0x0) {
        return -2;
      }
    }
    memcpy(this->gCategoryWeights[(uint)categoryWeightsIndex],inCategoryWeights,
           (ulong)(uint)this->kCategoryCount << 3);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryWeights(int categoryWeightsIndex,
                                                 const double* inCategoryWeights) {
    if (categoryWeightsIndex < 0 || categoryWeightsIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryWeights[categoryWeightsIndex] == NULL) {
        gCategoryWeights[categoryWeightsIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kCategoryCount);
        if (gCategoryWeights[categoryWeightsIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gCategoryWeights[categoryWeightsIndex], inCategoryWeights, kCategoryCount);

    return BEAGLE_SUCCESS;
}